

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

void * mpp_enc_thread(void *data)

{
  RK_S32 *pRVar1;
  MppEncImpl *enc;
  MppPacket pvVar2;
  EncImpl pvVar3;
  Mpp *mpp;
  MppEnc pvVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  MppEncRefMode MVar10;
  RK_S32 RVar11;
  MppPacket *ppvVar12;
  MppTask *ppvVar13;
  pthread_mutex_t *__mutex;
  RK_U8 *pRVar14;
  MppEncImpl *pMVar15;
  ushort uVar16;
  MppThreadStatus MVar17;
  MPP_RET MVar18;
  RK_U32 RVar19;
  RK_S64 RVar20;
  MppStopwatch stopwatch;
  MppBuffer pvVar21;
  size_t sVar22;
  void *pvVar23;
  byte bVar24;
  uint uVar25;
  char *pcVar26;
  EncAsyncStatus EVar27;
  ulong uVar28;
  ulong uVar29;
  MppEncRefFrmUsrCfg *pMVar30;
  MppEncHal hal;
  MppTask task;
  uint uVar31;
  undefined8 uVar32;
  MppFrame *frame;
  MppThread *this;
  bool bVar33;
  MppEncImpl *pMVar34;
  bool bVar35;
  MppPskipMode skip_mode;
  void *in_stack_fffffffffffffcb8;
  undefined8 uVar36;
  undefined4 uVar37;
  size_t in_stack_fffffffffffffcc0;
  uint local_30c;
  MppPskipMode local_308;
  MppThread *local_300;
  void *local_2f8;
  MppEncImpl *local_2f0;
  MppPacket *local_2e8;
  MppTask *local_2e0;
  pthread_mutex_t *local_2d8;
  MppEncRefFrmUsrCfg *local_2d0;
  MppEncHal local_2c8;
  MppFrame *local_2c0;
  MppBuffer *local_2b8;
  EncAsyncTaskInfo local_2b0;
  pthread_mutex_t *local_78;
  MppEncRefFrmUsrCfg *local_70;
  MppBuffer *local_68;
  MppTask *local_60;
  EncRcTaskInfo *local_58;
  sem_t *local_50;
  sem_t *local_48;
  sem_t *local_40;
  pthread_cond_t *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  this = enc->thread_enc;
  local_2f8 = data;
  memset(&local_2b0,0,0x238);
  RVar20 = mpp_time();
  enc->time_base = RVar20;
  local_2d8 = (pthread_mutex_t *)this->mMutexCond;
  pthread_mutex_lock(local_2d8);
  MVar17 = MppThread::get_status(this,THREAD_WORK);
  if (MVar17 == MPP_THREAD_RUNNING) {
    local_38 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
    local_40 = (sem_t *)&enc->cmd_start;
    local_48 = (sem_t *)&enc->cmd_done;
    local_70 = &enc->frm_cfg;
    local_78 = (pthread_mutex_t *)(this->mMutexCond + 3);
    local_50 = (sem_t *)&enc->enc_reset;
    local_2d0 = &local_2b0.usr;
    local_2e0 = &enc->task_in;
    local_60 = &enc->task_out;
    local_2c0 = &enc->frame;
    local_2e8 = &enc->packet;
    local_68 = &enc->md_info;
    local_2b8 = &enc->frm_buf;
    local_58 = &enc->rc_info_prev;
    local_30c = 0;
    local_300 = this;
    do {
      uVar31 = enc->notify_flag;
      RVar19 = 0;
      bVar33 = true;
      if (enc->reset_flag == 0) {
        if ((uVar31 & 0x10) != 0) {
          RVar19 = uVar31 & 0xffffffef;
          goto LAB_0013e017;
        }
        bVar35 = (uVar31 & local_30c) != 0;
        bVar33 = bVar35 || (short)local_30c == 0;
        pcVar26 = "wait";
        if (bVar35 || (short)local_30c == 0) {
          pcVar26 = "work";
        }
      }
      else {
LAB_0013e017:
        pcVar26 = "work";
      }
      if ((mpp_enc_debug & 0x10) != 0) {
        in_stack_fffffffffffffcc0 =
             CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),~local_30c & enc->status_flag);
        in_stack_fffffffffffffcb8 =
             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),local_30c);
        _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_task_wait",
                   enc,(ulong)enc->status_flag,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0,
                   uVar31,pcVar26);
      }
      enc->status_flag = local_30c;
      enc->notify_flag = RVar19;
      if (bVar33) {
        enc->work_count = enc->work_count + 1;
      }
      else {
        enc->wait_count = enc->wait_count + 1;
        MVar17 = this->mStatus[0];
        this->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_38,local_2d8);
        if (this->mStatus[0] == MPP_THREAD_WAITING) {
          this->mStatus[0] = MVar17;
        }
      }
      pthread_mutex_unlock(local_2d8);
      if ((local_2b0.status.val >> 8 & 1) == 0) {
        if (enc->cmd_send == enc->cmd_recv) {
          if (enc->reset_flag == 0) {
            MVar18 = MPP_OK;
            if ((local_2b0.status.val & 2) == 0) {
              MVar18 = _mpp_port_poll("try_get_enc_task",enc->input,MPP_POLL_NON_BLOCK);
              if (MPP_NOK < MVar18) {
                local_2b0.status.val = local_2b0.status.val | 2;
                local_30c = local_30c & 0xfffe;
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task in ready\n","try_get_enc_task");
                }
                goto LAB_0013e30c;
              }
              local_30c = local_30c | 1;
              goto LAB_00140c7b;
            }
LAB_0013e30c:
            frame = local_2c0;
            if ((local_2b0.status.val & 4) == 0) {
              MVar18 = _mpp_port_poll("try_get_enc_task",enc->output,MPP_POLL_NON_BLOCK);
              frame = local_2c0;
              if (MVar18 < MPP_OK) {
                local_30c = local_30c | 8;
                goto LAB_00140c7b;
              }
              local_2b0.status.val = local_2b0.status.val | 4;
              local_30c = local_30c & 0xfff7;
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task out ready\n","try_get_enc_task");
              }
            }
            if ((local_2b0.status.val & 8) == 0) {
              _mpp_port_dequeue("try_get_enc_task",enc->input,local_2e0);
              if (enc->task_in == (MppTask)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85b);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_in",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
              }
              MVar18 = _mpp_port_dequeue("try_get_enc_task",enc->output,local_60);
              if (enc->task_out == (MppTask)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85e);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_out",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
              }
              ppvVar13 = local_2e0;
              mpp_task_meta_get_frame(*local_2e0,KEY_INPUT_FRAME,frame);
              ppvVar12 = local_2e8;
              mpp_task_meta_get_packet(*ppvVar13,KEY_OUTPUT_PACKET,local_2e8);
              mpp_task_meta_get_buffer(*ppvVar13,KEY_MOTION_INFO,local_68);
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task dequeue done frm %p pkt %p\n","try_get_enc_task",*frame
                           ,*ppvVar12);
              }
              stopwatch = mpp_frame_get_stopwatch(*frame);
              mpp_stopwatch_record(stopwatch,"encode task start");
              *local_2b8 = (MppBuffer)0x0;
              local_2b8[1] = (MppBuffer)0x0;
              if (*ppvVar12 == (MppPacket)0x0) {
                mpp_packet_new(ppvVar12);
              }
              else {
                pvVar21 = mpp_packet_get_buffer(*ppvVar12);
                enc->pkt_buf = pvVar21;
              }
              if (*local_2c0 != (MppFrame)0x0) {
                RVar20 = mpp_frame_get_pts(*local_2c0);
                pvVar21 = mpp_frame_get_buffer(enc->frame);
                enc->task_pts = RVar20;
                enc->frm_buf = pvVar21;
                mpp_packet_set_pts(enc->packet,RVar20);
                pvVar2 = enc->packet;
                RVar20 = mpp_frame_get_dts(enc->frame);
                mpp_packet_set_dts(pvVar2,RVar20);
                RVar19 = mpp_frame_get_eos(enc->frame);
                if (RVar19 == 0) {
                  mpp_packet_clr_eos(enc->packet);
                }
                else {
                  mpp_packet_set_eos(enc->packet);
                }
                if ((*local_2c0 != (MppFrame)0x0) && (*local_2b8 != (MppBuffer)0x0)) {
                  local_2b0.status.val = local_2b0.status.val | 8;
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_enc_task");
                  }
                  goto LAB_0013e510;
                }
              }
              mpp_stopwatch_record(stopwatch,"invalid on check frm pkt");
              memset(&local_2b0.task,0,0xb8);
              this = local_300;
            }
            else {
              stopwatch = (MppStopwatch)0x0;
LAB_0013e510:
              EVar27 = local_2b0.status;
              uVar31 = local_2b0.seq_idx;
              if ((local_2b0.status.val & 0x10) == 0) {
                memset(&local_2b0.task,0,0x208);
                RVar5 = local_70->force_idr;
                RVar6 = local_70->force_pskip;
                RVar7 = local_70->force_nonref;
                RVar8 = local_70->force_lt_idx;
                RVar9 = local_70->force_temporal_id;
                MVar10 = local_70->force_ref_mode;
                RVar11 = local_70->force_ref_arg;
                local_2d0->force_flag = local_70->force_flag;
                local_2d0->force_idr = RVar5;
                local_2d0->force_pskip = RVar6;
                local_2d0->force_nonref = RVar7;
                local_2d0->force_lt_idx = RVar8;
                local_2d0->force_temporal_id = RVar9;
                local_2d0->force_ref_mode = MVar10;
                local_2d0->force_ref_arg = RVar11;
                (enc->frm_cfg).force_flag = 0;
                local_2b0.task.rc_task = &local_2b0.rc;
                local_2b0.task.frm_cfg = local_2d0;
                local_2b0.task.frame = enc->frame;
                local_2b0.task.input = enc->frm_buf;
                local_2b0.task.packet = enc->packet;
                local_2b0.task.output = enc->pkt_buf;
                local_2b0.task.md_info = enc->md_info;
                local_2b0.rc.frm.val = (ulong)(uint)local_2b0.seq_idx << 0x30;
                local_2b0.rc.frame = enc->frame;
                uVar31 = local_2b0.seq_idx + 1U;
                local_2b0.task.stopwatch = stopwatch;
                if ((mpp_enc_debug & 0x20) != 0) {
                  uVar16 = (ushort)local_2b0.seq_idx;
                  local_2b0.seq_idx = local_2b0.seq_idx + 1U;
                  _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_enc_task",(ulong)uVar16)
                  ;
                  EVar27 = local_2b0.status;
                  uVar31 = local_2b0.seq_idx;
                }
              }
              local_2b0.seq_idx = uVar31;
              if ((EVar27.val & 0x20) == 0) {
                MVar18 = rc_frm_check_drop(enc->rc_ctx,&local_2b0.rc);
                if (MVar18 != MPP_OK) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_drop:%-4d failed return %d",
                             (char *)0x0,enc->mpp,0x88f,in_stack_fffffffffffffcb8);
                  this = local_300;
                  goto LAB_0013ed02;
                }
                local_2b0.status.val = local_2b0.status.val | 0x20;
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_enc_task",
                             local_2b0.rc.frm.val >> 0x30,
                             (ulong)((uint)((ulong)local_2b0.rc.frm >> 0x20) & 1));
                }
                local_2b0.task.valid = 1;
                MVar18 = MPP_OK;
                if ((local_2b0.rc.frm.val & 0x100000000) != 0) {
                  mpp_stopwatch_record(stopwatch,"invalid on frame rate drop");
                  this = local_300;
                  local_2b0.task.length = 0;
                  local_2b0.task.flags.drop_by_fps = 1;
                  EVar27.val = local_2b0.status.val | 0x100;
                  uVar31 = local_2b0.status.val >> 9;
                  local_2b0.status.val = EVar27.val;
                  if ((uVar31 & 1) == 0) {
                    if (local_2b0.usr.force_flag != 0) {
                      mpp_enc_refs_set_usr_cfg(enc->refs,local_2d0);
                    }
                    local_2b0.status.val = local_2b0.status.val | 0x200;
                  }
                  goto LAB_0013eec6;
                }
              }
              else if (local_2b0.task.valid == 0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8a6);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "hal_task->valid","try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
              }
              ppvVar12 = local_2e8;
              this = local_300;
              if ((local_2b0.status.val & 0x80) == 0) {
                pvVar21 = enc->pkt_buf;
                if (pvVar21 == (MppBuffer)0x0) {
                  uVar25 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                           ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
                  uVar31 = uVar25 * 3 >> 1;
                  if (enc->coding != MPP_VIDEO_CodingMJPEG) {
                    uVar31 = uVar25;
                  }
                  pvVar23 = enc->mpp;
                  pvVar2 = enc->packet;
                  local_308.pskip_is_ref = 0;
                  local_308.pskip_is_non_ref = 0;
                  if (uVar31 == 0) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x611);
                    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                               "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
                  }
                  mpp_buffer_get_with_tag
                            (*(MppBufferGroup *)((long)pvVar23 + 0x38),(MppBuffer *)&local_308,
                             (ulong)uVar31,"mpp_enc","mpp_enc_check_pkt_buf");
                  mpp_buffer_attach_dev_f("mpp_enc_check_pkt_buf",(MppBuffer)local_308,enc->dev);
                  this = local_300;
                  if (local_308 == (MppPskipMode)0x0) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x614);
                    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                               "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
                    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
                  }
                  enc->pkt_buf = (MppBuffer)local_308;
                  pvVar23 = mpp_buffer_get_ptr_with_caller
                                      ((MppBuffer)local_308,"mpp_enc_check_pkt_buf");
                  *(void **)((long)pvVar2 + 8) = pvVar23;
                  *(void **)((long)pvVar2 + 0x10) = pvVar23;
                  sVar22 = mpp_buffer_get_size_with_caller
                                     ((MppBuffer)local_308,"mpp_enc_check_pkt_buf");
                  *(size_t *)((long)pvVar2 + 0x18) = sVar22;
                  *(undefined8 *)((long)pvVar2 + 0x20) = 0;
                  *(MppPskipMode *)((long)pvVar2 + 0x40) = local_308;
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","create output pkt %p buf %p\n","mpp_enc_check_pkt_buf",
                               *local_2e8);
                  }
                }
                else if ((mpp_enc_debug & 0x20) != 0) {
                  pvVar2 = *local_2e8;
                  in_stack_fffffffffffffcb8 = mpp_packet_get_pos(pvVar2);
                  in_stack_fffffffffffffcc0 = mpp_packet_get_length(*ppvVar12);
                  this = local_300;
                  _mpp_log_l(4,"mpp_enc","output to pkt %p buf %p pos %p length %d\n",
                             "mpp_enc_check_pkt_buf",pvVar2,pvVar21,in_stack_fffffffffffffcb8,
                             in_stack_fffffffffffffcc0);
                }
                local_2b0.status.val = local_2b0.status.val | 0x80;
                local_2b0.task.output = enc->pkt_buf;
              }
              if (*local_2e8 == (MppPacket)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8af);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->packet",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
              }
              if (enc->pkt_buf == (MppBuffer)0x0) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8b0);
                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->pkt_buf",
                           "try_get_enc_task",in_stack_fffffffffffffcb8);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
              }
              if (enc->hal_info_updated == 0) {
                update_enc_hal_info(enc);
                enc->hal_info_updated = 1;
              }
              if (((uint)enc->hdr_status & 1) == 0) {
                enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
                sVar22 = mpp_packet_get_length(enc->hdr_pkt);
                enc->hdr_len = (RK_U32)sVar22;
                *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_enc_task",
                             local_2b0.rc.frm.val >> 0x30,sVar22 & 0xffffffff);
                }
                mpp_packet_append(enc->packet,enc->hdr_pkt);
                local_2b0.task.header_length = enc->hdr_len;
                local_2b0.task.length = local_2b0.task.header_length + local_2b0.task.length;
                *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
              }
              check_hal_task_pkt_len
                        ((HalEncTask *)local_2b0.task.packet,(char *)(ulong)local_2b0.task.length);
              if ((local_2b0.status.val >> 8 & 1) == 0) {
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_enc_task",
                             local_2b0.rc.frm.val >> 0x30);
                }
                MVar18 = enc_impl_start(enc->impl,&local_2b0.task);
                if (MVar18 != MPP_OK) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_start:%-4d failed return %d",(char *)0x0,
                             enc->mpp,0x8cd,in_stack_fffffffffffffcb8);
                  goto LAB_0013ed02;
                }
                local_2b0.status.val = local_2b0.status.val | 0x100;
                MVar18 = MPP_OK;
              }
              if ((local_2b0.status.val >> 9 & 1) == 0) {
                if (local_2b0.usr.force_flag != 0) {
                  mpp_enc_refs_set_usr_cfg(enc->refs,local_2d0);
                }
                local_2b0.status.val = local_2b0.status.val | 0x200;
              }
              if ((local_2b0.status.val >> 0xb & 1) == 0) {
                mpp_enc_refs_stash(enc->refs);
                local_2b0.status.val = local_2b0.status.val | 0x800;
              }
              if (MVar18 == MPP_OK) goto LAB_0013eec6;
            }
LAB_0013ed02:
            mpp_stopwatch_record(local_2b0.task.stopwatch,"encode task done");
            if (*local_2e8 != (MppPacket)0x0) {
              mpp_packet_set_length(*local_2e8,(ulong)local_2b0.task.length);
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","mpp_enc_terminate_task",
                           local_2b0.rc.frm.val >> 0x30,enc->task_pts);
              }
              mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,enc->packet);
              _mpp_port_enqueue("mpp_enc_terminate_task",enc->output,enc->task_out);
            }
            task = *local_2e0;
            if (task != (MppTask)0x0) {
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","mpp_enc_terminate_task",
                           local_2b0.rc.frm.val >> 0x30,enc->task_pts);
                task = enc->task_in;
              }
              mpp_task_meta_set_frame(task,KEY_INPUT_FRAME,enc->frame);
              _mpp_port_enqueue("mpp_enc_terminate_task",enc->input,enc->task_in);
            }
            goto LAB_0013fd8c;
          }
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","thread reset start\n","mpp_enc_thread");
          }
          __mutex = local_2d8;
          pthread_mutex_lock(local_2d8);
          enc->status_flag = 0;
          pthread_mutex_unlock(__mutex);
          *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
          pRVar1 = &(enc->frm_cfg).force_idr;
          *pRVar1 = *pRVar1 + 1;
          pthread_mutex_lock(local_78);
          enc->reset_flag = 0;
          sem_post(local_50);
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_thread");
          }
          pthread_mutex_unlock(local_78);
        }
        else {
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_thread",(ulong)enc->cmd_recv,
                       (ulong)enc->cmd);
          }
          sem_wait(local_40);
          MVar18 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
          if (MVar18 != MPP_OK) {
            *enc->cmd_ret = MVar18;
          }
          uVar31 = enc->cmd_recv + 1;
          enc->cmd_recv = uVar31;
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_thread",(ulong)uVar31,
                       (ulong)enc->cmd_send);
          }
          enc->param = (void *)0x0;
          enc->cmd = 0;
          sem_post(local_48);
          mpp_enc_hal_prepare(enc->enc_hal);
          mpp_enc_proc_rc_update(enc);
        }
        local_30c = 0;
      }
      else {
LAB_0013eec6:
        if ((local_2b0.status.val >> 8 & 1) == 0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0xa89);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"status->enc_start",
                     "mpp_enc_thread",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00140fe7:
            abort();
          }
          if ((local_2b0.status.val >> 8 & 1) != 0) goto LAB_0013ef1f;
        }
        else {
LAB_0013ef1f:
          pvVar2 = local_2b0.task.packet;
          if (enc->low_delay_part_mode == 0) {
            bVar33 = true;
            if (local_2b0.task.flags.drop_by_fps == 0) {
              mpp = (Mpp *)enc->mpp;
              pMVar34 = (MppEncImpl *)mpp->mEnc;
              pvVar3 = pMVar34->impl;
              local_2f0 = (MppEncImpl *)pMVar34->enc_hal;
              if ((pMVar34->support_hw_deflicker == 0) || ((pMVar34->cfg).rc.debreath_en == 0)) {
LAB_0013f145:
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","mpp_enc_normal",
                             local_2b0.rc.frm.val >> 0x30);
                }
                if ((local_2b0.status.val & 0x40) == 0) {
                  local_2b0.status.val = local_2b0.status.val | 0x40;
                  mpp_enc_get_pskip_mode(*(Mpp **)((long)pMVar34->mpp + 0xb0),&local_2b0,&local_308)
                  ;
                  if (local_308.pskip_is_non_ref == 0 && local_308.pskip_is_ref == 0)
                  goto LAB_0013f202;
                  MVar18 = mpp_enc_force_pskip((Mpp *)pMVar34->mpp,&local_2b0);
                  if (MVar18 != MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","mpp_enc_normal",
                                 local_2b0.rc.frm.val >> 0x30);
                    }
                    goto LAB_0013f202;
                  }
LAB_0013fdc8:
                  this = local_300;
                  if ((local_2b0.rc.frm.val >> 0x22 & 1) != 0) {
                    while ((uint)(byte)((ulong)local_2b0.rc.frm >> 0x28) <
                           (enc->cfg).rc.max_reenc_times) {
                      local_2b0.task.length = local_2b0.task.length - local_2b0.task.hw_length;
                      local_2b0.task.hw_length = 0;
                      mpp_packet_set_segment_nb(local_2b0.task.packet,local_2b0.task.segment_nb);
                      if ((mpp_enc_debug & 0x20) != 0) {
                        uVar31 = (uint)((ulong)local_2b0.rc.frm >> 0x20);
                        in_stack_fffffffffffffcb8 =
                             (void *)(CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                               uVar31 >> 8) & 0xffffffff000000ff);
                        _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n","try_proc_normal_task",
                                   local_2b0.rc.frm.val >> 0x30,(ulong)(uVar31 >> 2 & 1),
                                   in_stack_fffffffffffffcb8);
                      }
                      if ((local_2b0.rc.frm.val & 0x100000000) != 0) {
                        pvVar4 = mpp->mEnc;
                        if ((mpp_enc_debug & 1) != 0) {
                          _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_drop");
                        }
                        mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar4 + 0x210));
                        local_2b0.rc.info.quality_real = local_2b0.rc.info.quality_target;
                        local_2b0.rc.info.bit_real = local_2b0.task.length;
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","mpp_enc_reenc_drop",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = rc_frm_end(*(RcCtx *)((long)pvVar4 + 0x60),&local_2b0.rc);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",
                                     (char *)0x0,mpp,0x7e2,in_stack_fffffffffffffcb8);
                        }
                        pcVar26 = "mpp_enc_reenc_drop";
joined_r0x001405f3:
                        if ((mpp_enc_debug & 1) != 0) {
                          _mpp_log_l(4,"mpp_enc","leave\n",pcVar26);
                        }
                        break;
                      }
                      if ((local_2b0.rc.frm.val & 0x10000000a0) == 0x1000000000) {
                        pvVar4 = mpp->mEnc;
                        pvVar3 = *(EncImpl *)((long)pvVar4 + 8);
                        if ((mpp_enc_debug & 1) != 0) {
                          _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_force_pskip");
                        }
                        local_2b0.usr.force_pskip = local_2b0.usr.force_pskip + 1;
                        local_2b0.usr.force_flag = local_2b0.usr.force_flag | 0x40;
                        mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar4 + 0x210));
                        mpp_enc_refs_set_usr_cfg(*(MppEncRefs *)((long)pvVar4 + 0x210),local_2d0);
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n",
                                     "mpp_enc_reenc_force_pskip",local_2b0.rc.frm.val >> 0x30);
                        }
                        mpp_enc_refs_get_cpb
                                  (*(MppEncRefs *)((long)pvVar4 + 0x210),&local_2b0.rc.cpb);
                        if ((mpp_enc_debug & 0x10000) != 0) {
                          _mpp_log_l(4,"mpp_enc",
                                     "frm %d start ***********************************\n",
                                     "mpp_enc_reenc_force_pskip",
                                     (ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_);
                        }
                        MVar18 = enc_impl_proc_dpb(pvVar3,&local_2b0.task);
                        if (MVar18 == MPP_OK) {
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d enc sw enc start\n",
                                       "mpp_enc_reenc_force_pskip",local_2b0.rc.frm.val >> 0x30);
                          }
                          MVar18 = enc_impl_sw_enc(pvVar3,&local_2b0.task);
                          if (MVar18 != MPP_OK) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar18);
                            pcVar26 = "mpp %p enc_impl_sw_enc:%-4d failed return %d";
                            uVar32 = 0x805;
                            goto LAB_00140800;
                          }
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d rc frame end\n",
                                       "mpp_enc_reenc_force_pskip",local_2b0.rc.frm.val >> 0x30);
                          }
                          MVar18 = rc_frm_end(*(RcCtx *)((long)pvVar4 + 0x60),&local_2b0.rc);
                          if (MVar18 != MPP_OK) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar18);
                            pcVar26 = "mpp %p rc_frm_end:%-4d failed return %d";
                            uVar32 = 0x808;
                            goto LAB_00140800;
                          }
                        }
                        else {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                          uVar32 = 0x802;
LAB_00140800:
                          _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,mpp,uVar32,
                                     in_stack_fffffffffffffcb8);
                        }
                        pcVar26 = "mpp_enc_reenc_force_pskip";
                        goto joined_r0x001405f3;
                      }
                      local_2b0.rc.frm.val = local_2b0.rc.frm.val & 0xffffffeeffffffff;
                      pvVar4 = mpp->mEnc;
                      pvVar23 = *(void **)((long)pvVar4 + 0x10);
                      if ((mpp_enc_debug & 1) != 0) {
                        _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_simple");
                      }
                      local_2b0.rc.info.reserve[0] = 0;
                      local_2b0.rc.info.reserve[1] = 0;
                      local_2b0.rc.info.reserve[2] = 0;
                      local_2b0.rc.info.reserve[3] = 0;
                      local_2b0.rc.info.complex_scene = 0;
                      local_2b0.rc.info.scene_mode = 0;
                      local_2b0.rc.info.last_scene_mode = 0;
                      local_2b0.rc.info.rt_bits = 0;
                      local_2b0.rc.info.lvl8_intra_num = 0;
                      local_2b0.rc.info.lvl4_intra_num = 0;
                      local_2b0.rc.info.motion_level = 0;
                      local_2b0.rc.info.complex_level = 0;
                      local_2b0.rc.info.lvl16_inter_num = 0;
                      local_2b0.rc.info.lvl8_inter_num = 0;
                      local_2b0.rc.info.lvl32_intra_num = 0;
                      local_2b0.rc.info.lvl16_intra_num = 0;
                      local_2b0.rc.info.sse = 0;
                      local_2b0.rc.info.lvl64_inter_num = 0;
                      local_2b0.rc.info.lvl32_inter_num = 0;
                      local_2b0.rc.info.madi = 0;
                      local_2b0.rc.info.madp = 0;
                      local_2b0.rc.info.iblk4_prop = 0;
                      local_2b0.rc.info._52_4_ = 0;
                      local_2b0.rc.info.bit_real = 0;
                      local_2b0.rc.info.quality_real = 0;
                      local_2b0.rc.info._8_8_ = local_2b0.rc.info._8_8_ & 0xffffffff00000000;
                      if ((mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_reenc_simple",
                                   local_2b0.rc.frm.val >> 0x30);
                      }
                      MVar18 = enc_impl_proc_hal(*(EncImpl *)((long)pvVar4 + 8),&local_2b0.task);
                      if (MVar18 == MPP_OK) {
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_get_task(pvVar23,&local_2b0.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                          uVar32 = 0x7b4;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = rc_hal_start(*(RcCtx *)((long)pvVar4 + 0x60),&local_2b0.rc);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p rc_hal_start:%-4d failed return %d";
                          uVar32 = 0x7b7;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_reenc_simple"
                                     ,local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_gen_regs(pvVar23,&local_2b0.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                          uVar32 = 0x7ba;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_start(pvVar23,&local_2b0.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                          uVar32 = 0x7bd;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_wait(pvVar23,&local_2b0.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                          uVar32 = 0x7c0;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = rc_hal_end(*(RcCtx *)((long)pvVar4 + 0x60),&local_2b0.rc);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p rc_hal_end:%-4d failed return %d";
                          uVar32 = 0x7c3;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_reenc_simple",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_ret_task(pvVar23,&local_2b0.task);
                        if (MVar18 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                          pcVar26 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                          uVar32 = 0x7c6;
                          goto LAB_0014036b;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n",
                                     "mpp_enc_reenc_simple",local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = rc_frm_check_reenc(*(RcCtx *)((long)pvVar4 + 0x60),&local_2b0.rc);
                        uVar37 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
                        if (MVar18 == MPP_OK) {
                          if ((mpp_enc_debug & 0x20) != 0) {
                            uVar31 = (uint)((ulong)local_2b0.rc.frm >> 0x20);
                            in_stack_fffffffffffffcb8 =
                                 (void *)(CONCAT44(uVar37,uVar31 >> 8) & 0xffffffff000000ff);
                            _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n",
                                       "mpp_enc_reenc_simple",local_2b0.rc.frm.val >> 0x30,
                                       (ulong)(uVar31 >> 2 & 1),in_stack_fffffffffffffcb8);
                          }
                          this = local_300;
                          if ((mpp_enc_debug & 1) != 0) {
                            _mpp_log_l(4,"mpp_enc","leave\n","mpp_enc_reenc_simple");
                          }
                        }
                        else {
                          in_stack_fffffffffffffcb8 = (void *)CONCAT44(uVar37,MVar18);
                          _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_reenc:%-4d failed return %d",
                                     (char *)0x0,mpp,0x7c9,in_stack_fffffffffffffcb8);
                          this = local_300;
                        }
                      }
                      else {
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        pcVar26 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                        uVar32 = 0x7b1;
LAB_0014036b:
                        _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,mpp,uVar32,
                                   in_stack_fffffffffffffcb8);
                      }
                      if ((local_2b0.rc.frm.val & 0x400000000) == 0) break;
                    }
                  }
                  bVar33 = true;
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","try_proc_normal_task",
                               local_2b0.rc.frm.val >> 0x30);
                  }
                  MVar18 = rc_frm_end(enc->rc_ctx,&local_2b0.rc);
                  if (MVar18 == MPP_OK) {
                    RVar20 = mpp_time();
                    enc->time_end = RVar20;
                    enc->frame_count = enc->frame_count + 1;
                    if (((enc->dev != (MppDev)0x0) && (enc->time_base != 0)) &&
                       ((RVar20 != 0 && (999999 < RVar20 - enc->time_base)))) {
                      update_hal_info_fps(enc);
                    }
                    local_2b0.rc.frm.val = local_2b0.rc.frm.val & 0xffff00fbffffffff;
                    local_2b0.usr.force_flag = 0;
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    bVar33 = false;
                    _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,mpp
                               ,0xa09,in_stack_fffffffffffffcb8);
                  }
                  goto LAB_0013fc17;
                }
LAB_0013f202:
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_normal",
                             local_2b0.rc.frm.val >> 0x30);
                }
                mpp_enc_refs_get_cpb(pMVar34->refs,&local_2b0.rc.cpb);
                if ((mpp_enc_debug & 0x10000) != 0) {
                  _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                             "mpp_enc_normal",(ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_);
                }
                MVar18 = enc_impl_proc_dpb(pvVar3,&local_2b0.task);
                if (MVar18 == MPP_OK) {
                  if ((((mpp_enc_debug >> 0x10 & 1) != 0) &&
                      (_mpp_log_l(4,"mpp_enc","frm %d compare\n","mpp_enc_normal",
                                  (ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_),
                      (mpp_enc_debug >> 0x10 & 1) != 0)) &&
                     (_mpp_log_l(4,"mpp_enc","seq_idx      %d vs %d\n","mpp_enc_normal",
                                 local_2b0.rc.frm.val >> 0x30,
                                 (ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_),
                     (mpp_enc_debug >> 0x10 & 1) != 0)) {
                    _mpp_log_l(4,"mpp_enc","is_idr       %d vs %d\n","mpp_enc_normal",
                               (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 5 & 1),
                               (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 5 & 1));
                    if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","is_intra     %d vs %d\n","mpp_enc_normal",
                                 (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 4 & 1),
                                 (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 4 & 1));
                      if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                        _mpp_log_l(4,"mpp_enc","is_non_ref   %d vs %d\n","mpp_enc_normal",
                                   (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 6 & 1),
                                   (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 6 & 1));
                        if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                          _mpp_log_l(4,"mpp_enc","is_lt_ref    %d vs %d\n","mpp_enc_normal",
                                     (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 7 & 1),
                                     (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 7 & 1));
                          if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                            _mpp_log_l(4,"mpp_enc","lt_idx       %d vs %d\n","mpp_enc_normal",
                                       (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 8 & 0xf),
                                       (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 8 & 0xf));
                            if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                              _mpp_log_l(4,"mpp_enc","temporal_id  %d vs %d\n","mpp_enc_normal",
                                         (ulong)((uint)local_2b0.rc.frm.val._0_4_ >> 0xc & 0xf),
                                         (ulong)((uint)local_2b0.rc.cpb.curr.val._0_4_ >> 0xc & 0xf)
                                        );
                              if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                                _mpp_log_l(4,"mpp_enc",
                                           "frm %d done  ***********************************\n",
                                           "mpp_enc_normal",
                                           (ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","mpp_enc_normal",
                               local_2b0.rc.frm.val >> 0x30);
                  }
                  MVar18 = rc_frm_start(pMVar34->rc_ctx,&local_2b0.rc);
                  if (MVar18 == MPP_OK) {
                    mpp_enc_add_sw_header(pMVar34,&local_2b0.task);
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_normal",
                                 local_2b0.rc.frm.val >> 0x30);
                    }
                    MVar18 = enc_impl_proc_hal(pvVar3,&local_2b0.task);
                    if (MVar18 == MPP_OK) {
                      if ((mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_normal",
                                   local_2b0.rc.frm.val >> 0x30);
                      }
                      MVar18 = mpp_enc_hal_get_task(local_2f0,&local_2b0.task);
                      if (MVar18 == MPP_OK) {
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_normal",
                                     local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = rc_hal_start(pMVar34->rc_ctx,&local_2b0.rc);
                        if (MVar18 == MPP_OK) {
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_normal",
                                       local_2b0.rc.frm.val >> 0x30);
                          }
                          MVar18 = mpp_enc_hal_gen_regs(local_2f0,&local_2b0.task);
                          if (MVar18 == MPP_OK) {
                            local_2b0.task.segment_nb =
                                 mpp_packet_get_segment_nb(local_2b0.task.packet);
                            mpp_stopwatch_record(local_2b0.task.stopwatch,"encode hal start");
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_normal",
                                         local_2b0.rc.frm.val >> 0x30);
                            }
                            MVar18 = mpp_enc_hal_start(local_2f0,&local_2b0.task);
                            if (MVar18 == MPP_OK) {
                              if ((mpp_enc_debug & 0x20) != 0) {
                                _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_normal",
                                           local_2b0.rc.frm.val >> 0x30);
                              }
                              MVar18 = mpp_enc_hal_wait(local_2f0,&local_2b0.task);
                              if (MVar18 == MPP_OK) {
                                mpp_stopwatch_record(local_2b0.task.stopwatch,"encode hal finish");
                                if ((mpp_enc_debug & 0x20) != 0) {
                                  _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_normal",
                                             local_2b0.rc.frm.val >> 0x30);
                                }
                                MVar18 = rc_hal_end(pMVar34->rc_ctx,&local_2b0.rc);
                                if (MVar18 == MPP_OK) {
                                  if ((mpp_enc_debug & 0x20) != 0) {
                                    _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_normal"
                                               ,local_2b0.rc.frm.val >> 0x30);
                                  }
                                  MVar18 = mpp_enc_hal_ret_task(local_2f0,&local_2b0.task);
                                  if (MVar18 == MPP_OK) {
                                    if ((mpp_enc_debug & 0x20) != 0) {
                                      _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n",
                                                 "mpp_enc_normal",local_2b0.rc.frm.val >> 0x30);
                                    }
                                    MVar18 = rc_frm_check_reenc(pMVar34->rc_ctx,&local_2b0.rc);
                                    if (MVar18 == MPP_OK) goto LAB_0013fdc8;
                                    uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20
                                                           ),MVar18);
                                    pcVar26 = "mpp %p rc_frm_check_reenc:%-4d failed return %d";
                                    uVar32 = 0x78d;
                                  }
                                  else {
                                    uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20
                                                           ),MVar18);
                                    pcVar26 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                                    uVar32 = 0x78a;
                                  }
                                }
                                else {
                                  uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                    MVar18);
                                  pcVar26 = "mpp %p rc_hal_end:%-4d failed return %d";
                                  uVar32 = 0x787;
                                }
                              }
                              else {
                                uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar18);
                                pcVar26 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                                uVar32 = 0x782;
                              }
                            }
                            else {
                              uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar18);
                              pcVar26 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                              uVar32 = 0x77f;
                            }
                          }
                          else {
                            uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                            pcVar26 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                            uVar32 = 0x77a;
                          }
                        }
                        else {
                          uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                          pcVar26 = "mpp %p rc_hal_start:%-4d failed return %d";
                          uVar32 = 0x777;
                        }
                      }
                      else {
                        uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                        pcVar26 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                        uVar32 = 0x774;
                      }
                    }
                    else {
                      uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar26 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                      uVar32 = 0x771;
                    }
                  }
                  else {
                    uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar26 = "mpp %p rc_frm_start:%-4d failed return %d";
                    uVar32 = 0x76b;
                  }
                }
                else {
                  uVar36 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  pcVar26 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                  uVar32 = 0x75e;
                }
                _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,mpp,uVar32,uVar36);
                uVar37 = (undefined4)((ulong)uVar36 >> 0x20);
              }
              else {
                MVar18 = mpp_enc_proc_two_pass(mpp,&local_2b0);
                uVar37 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
                if (MVar18 == MPP_OK) goto LAB_0013f145;
              }
              in_stack_fffffffffffffcb8 = (void *)CONCAT44(uVar37,MVar18);
              bVar33 = false;
              _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_normal:%-4d failed return %d",(char *)0x0,mpp,
                         0x9f1,in_stack_fffffffffffffcb8);
              this = local_300;
            }
LAB_0013fc17:
            mpp_stopwatch_record(local_2b0.task.stopwatch,"encode task done");
            RVar19 = mpp_packet_is_partition(pvVar2);
            if (RVar19 == 0) {
              mpp_packet_set_length(pvVar2,(ulong)local_2b0.task.length);
            }
            if (bVar33) {
              set_enc_info_to_packet(enc,&local_2b0.task);
            }
            else {
              *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
              (enc->hdr_status).val = 0;
              mpp_packet_set_length(pvVar2,0);
              _mpp_log_l(2,"mpp_enc","enc failed force idr!\n","try_proc_normal_task");
            }
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","try_proc_normal_task",
                         local_2b0.rc.frm.val >> 0x30,enc->task_pts);
            }
            mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,pvVar2);
            _mpp_port_enqueue("try_proc_normal_task",enc->output,enc->task_out);
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_normal_task",
                         local_2b0.rc.frm.val >> 0x30,enc->task_pts);
            }
            mpp_task_meta_set_frame(enc->task_in,KEY_INPUT_FRAME,enc->frame);
            _mpp_port_enqueue("try_proc_normal_task",enc->input,enc->task_in);
            if ((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) {
              memcpy(local_58,&local_2b0.rc.info,0x88);
            }
LAB_0013fd8c:
            local_2e0[2] = (MppFrame)0x0;
            local_2e0[3] = (MppPacket)0x0;
            *local_2e0 = (MppTask)0x0;
            local_2e0[1] = (MppTask)0x0;
            *local_2b8 = (MppBuffer)0x0;
            local_2b8[1] = (MppBuffer)0x0;
            (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
            local_2b0.status.val = 0;
          }
          else {
            pMVar34 = *(MppEncImpl **)((long)local_2f8 + 0xb0);
            pMVar15 = pMVar34;
            if (local_2b0.task.flags.drop_by_fps == 0) {
              hal = pMVar34->enc_hal;
              if ((local_2b0.status.val >> 10 & 1) != 0) goto LAB_00140d02;
              pvVar3 = pMVar34->impl;
              local_2c8 = hal;
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","try_proc_low_deley_task"
                           ,local_2b0.rc.frm.val >> 0x30);
              }
              if ((local_2b0.status.val & 0x40) == 0) {
                local_2b0.status.val = local_2b0.status.val | 0x40;
                mpp_enc_get_pskip_mode(*(Mpp **)((long)pMVar34->mpp + 0xb0),&local_2b0,&local_308);
                if (local_308.pskip_is_non_ref != 0 || local_308.pskip_is_ref != 0) {
                  MVar18 = mpp_enc_force_pskip((Mpp *)pMVar34->mpp,&local_2b0);
                  if (MVar18 == MPP_OK) goto LAB_00140970;
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.",
                               "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30);
                  }
                }
              }
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","try_proc_low_deley_task",
                           local_2b0.rc.frm.val >> 0x30);
              }
              mpp_enc_refs_get_cpb(pMVar34->refs,&local_2b0.rc.cpb);
              if ((mpp_enc_debug & 0x10000) != 0) {
                _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                           "try_proc_low_deley_task",(ulong)(ushort)local_2b0.rc.cpb.curr.val._6_2_)
                ;
              }
              MVar18 = enc_impl_proc_dpb(pvVar3,&local_2b0.task);
              if (MVar18 == MPP_OK) {
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","try_proc_low_deley_task",
                             local_2b0.rc.frm.val >> 0x30);
                }
                MVar18 = rc_frm_start(pMVar34->rc_ctx,&local_2b0.rc);
                if (MVar18 == MPP_OK) {
                  mpp_enc_add_sw_header(pMVar34,&local_2b0.task);
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","try_proc_low_deley_task",
                               local_2b0.rc.frm.val >> 0x30);
                  }
                  MVar18 = enc_impl_proc_hal(pvVar3,&local_2b0.task);
                  if (MVar18 == MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal get task\n","try_proc_low_deley_task",
                                 local_2b0.rc.frm.val >> 0x30);
                    }
                    hal = local_2c8;
                    MVar18 = mpp_enc_hal_get_task(local_2c8,&local_2b0.task);
                    if (MVar18 == MPP_OK) {
                      if ((mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","try_proc_low_deley_task",
                                   local_2b0.rc.frm.val >> 0x30);
                      }
                      MVar18 = rc_hal_start(pMVar34->rc_ctx,&local_2b0.rc);
                      if (MVar18 == MPP_OK) {
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n",
                                     "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30);
                        }
                        MVar18 = mpp_enc_hal_gen_regs(hal,&local_2b0.task);
                        if (MVar18 == MPP_OK) {
                          local_2b0.task.part_first = 0;
                          local_2b0.task.part_last = 0;
                          do {
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d hal start\n","try_proc_low_deley_task"
                                         ,local_2b0.rc.frm.val >> 0x30);
                            }
                            MVar18 = mpp_enc_hal_part_start(hal,&local_2b0.task);
                            if (MVar18 != MPP_OK) {
                              in_stack_fffffffffffffcb8 =
                                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                    MVar18);
                              pcVar26 = "mpp %p mpp_enc_hal_part_start:%-4d failed return %d";
                              uVar32 = 0x924;
                              goto LAB_00140964;
                            }
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d hal wait\n","try_proc_low_deley_task",
                                         local_2b0.rc.frm.val >> 0x30);
                            }
                            MVar18 = mpp_enc_hal_part_wait(hal,&local_2b0.task);
                            if (MVar18 != MPP_OK) {
                              in_stack_fffffffffffffcb8 =
                                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                    MVar18);
                              pcVar26 = "mpp %p mpp_enc_hal_part_wait:%-4d failed return %d";
                              uVar32 = 0x927;
                              goto LAB_00140964;
                            }
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d hal ret task\n",
                                         "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30);
                            }
                            MVar18 = mpp_enc_hal_ret_task(hal,&local_2b0.task);
                            if (MVar18 != MPP_OK) {
                              in_stack_fffffffffffffcb8 =
                                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                    MVar18);
                              pcVar26 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                              uVar32 = 0x92a;
                              goto LAB_00140964;
                            }
                            if (local_2b0.task.part_first != 0) {
                              local_2b0.task.part_pos = (RK_U8 *)mpp_packet_get_pos(pvVar2);
                              local_2b0.task.part_length = 0;
                            }
                            mpp_packet_set_length(pvVar2,(ulong)local_2b0.task.length);
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d task_out %p\n",
                                         "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30,
                                         pMVar34->task_out);
                            }
LAB_00140d02:
                            if (pMVar34->task_out == (MppTask)0x0) {
                              if ((mpp_enc_debug & 0x20) != 0) {
                                _mpp_log_l(4,"mpp_enc","task %d poll new task for part output\n",
                                           "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30);
                              }
                              MVar18 = _mpp_port_poll("try_proc_low_deley_task",pMVar34->output,
                                                      MPP_POLL_NON_BLOCK);
                              if (MVar18 < MPP_OK) {
                                local_30c = local_30c | 8;
                                local_2b0.status.val = local_2b0.status.val | 0x400;
                                this = local_300;
                                goto LAB_00140c7b;
                              }
                              local_2b0.status.val = local_2b0.status.val | 4;
                              local_30c = local_30c & 0xfff7;
                              if ((mpp_enc_debug & 0x20) != 0) {
                                _mpp_log_l(4,"mpp_enc","task out ready\n","try_proc_low_deley_task")
                                ;
                              }
                              _mpp_port_dequeue("try_proc_low_deley_task",pMVar34->output,
                                                &pMVar34->task_out);
                              if (pMVar34->task_out == (MppTask)0x0) {
                                in_stack_fffffffffffffcb8 =
                                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20
                                                           ),0x947);
                                _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                                           "enc->task_out","try_proc_low_deley_task",
                                           in_stack_fffffffffffffcb8);
                                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140fe7;
                              }
                            }
                            if (local_2b0.task.part_last != 0) break;
                            local_2c8 = hal;
                            pvVar23 = mpp_packet_get_pos(pvVar2);
                            pRVar14 = local_2b0.task.part_pos;
                            uVar28 = (ulong)local_2b0.task.length;
                            local_308.pskip_is_ref = 0;
                            local_308.pskip_is_non_ref = 0;
                            if ((mpp_enc_debug & 0x20) != 0) {
                              in_stack_fffffffffffffcc0 =
                                   CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),
                                            local_2b0.task.length);
                              in_stack_fffffffffffffcb8 = pvVar23;
                              _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n",
                                         "try_proc_low_deley_task",(ulong)local_2b0.task.part_count,
                                         local_2b0.task.part_pos,pvVar23,in_stack_fffffffffffffcc0);
                            }
                            pMVar30 = (MppEncRefFrmUsrCfg *)((long)pvVar23 + uVar28);
                            mpp_packet_copy_init((MppPacket *)&local_308,pvVar2);
                            *(RK_U8 **)((long)local_308 + 0x10) = pRVar14;
                            *(ulong *)((long)local_308 + 0x20) =
                                 (long)pMVar30 - (long)pRVar14 & 0xffffffff;
                            *(undefined4 *)((long)local_308 + 0x38) = 0x10;
                            bVar24 = ((byte)local_2b0.task.part_first & 1) << 5 | 0x10;
                            *(byte *)((long)local_308 + 0x38) = bVar24;
                            *(byte *)((long)local_308 + 0x38) =
                                 ((byte)local_2b0.task.part_last & 1) << 6 | bVar24;
                            hal = local_2c8;
                            if ((mpp_enc_debug & 0x20) != 0) {
                              in_stack_fffffffffffffcb8 =
                                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                    (int)((long)pMVar30 - (long)pRVar14));
                              _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n",
                                         "try_proc_low_deley_task",(ulong)local_2b0.task.part_count,
                                         pRVar14,in_stack_fffffffffffffcb8);
                              hal = local_2c8;
                              if ((mpp_enc_debug & 0x20) != 0) {
                                in_stack_fffffffffffffcb8 =
                                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20
                                                           ),local_2b0.task.part_count);
                                local_2b0.task.part_pos = (RK_U8 *)pMVar30;
                                _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                                           "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30,
                                           pMVar34->task_pts,in_stack_fffffffffffffcb8);
                                pMVar30 = (MppEncRefFrmUsrCfg *)local_2b0.task.part_pos;
                              }
                            }
                            local_2b0.task.part_pos = (RK_U8 *)pMVar30;
                            mpp_task_meta_set_packet
                                      (pMVar34->task_out,KEY_OUTPUT_PACKET,(MppPacket)local_308);
                            _mpp_port_enqueue("try_proc_low_deley_task",pMVar34->output,
                                              pMVar34->task_out);
                            pMVar34->task_out = (MppTask)0x0;
                            local_2b0.task.part_count = local_2b0.task.part_count + 1;
                          } while (local_2b0.task.part_last == 0);
                          goto LAB_00140970;
                        }
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        pcVar26 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                        uVar32 = 0x91d;
                      }
                      else {
                        in_stack_fffffffffffffcb8 =
                             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18
                                             );
                        pcVar26 = "mpp %p rc_hal_start:%-4d failed return %d";
                        uVar32 = 0x91a;
                      }
                    }
                    else {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                      pcVar26 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                      uVar32 = 0x917;
                    }
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                    pcVar26 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                    uVar32 = 0x914;
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                  pcVar26 = "mpp %p rc_frm_start:%-4d failed return %d";
                  uVar32 = 0x90e;
                }
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
                pcVar26 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                uVar32 = 0x90b;
              }
LAB_00140964:
              _mpp_log_l(2,"mpp_enc",pcVar26,(char *)0x0,local_2f8,uVar32,in_stack_fffffffffffffcb8)
              ;
            }
LAB_00140970:
            while( true ) {
              local_2f0 = pMVar15;
              pvVar23 = mpp_packet_get_pos(pvVar2);
              pRVar14 = local_2b0.task.part_pos;
              uVar28 = (ulong)local_2b0.task.length;
              if ((mpp_enc_debug & 0x20) == 0) {
                uVar29 = (long)pvVar23 + (uVar28 - (long)local_2b0.task.part_pos);
                bVar33 = true;
              }
              else {
                in_stack_fffffffffffffcb8 = pvVar23;
                in_stack_fffffffffffffcc0 = uVar28;
                _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n","try_proc_low_deley_task",
                           (ulong)local_2b0.task.part_count,local_2b0.task.part_pos,pvVar23,uVar28);
                uVar29 = (long)pvVar23 + (uVar28 - (long)pRVar14);
                bVar33 = true;
                pMVar34 = local_2f0;
                if ((mpp_enc_debug & 0x20) != 0) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(int)uVar29)
                  ;
                  _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                             (ulong)local_2b0.task.part_count,pRVar14,in_stack_fffffffffffffcb8,
                             in_stack_fffffffffffffcc0);
                  bVar33 = (mpp_enc_debug & 0x20) == 0;
                  pMVar34 = local_2f0;
                }
              }
              pMVar30 = (MppEncRefFrmUsrCfg *)((long)pvVar23 + uVar28);
              ((MppSyntax *)((long)pvVar2 + 0x18))->data = (void *)(uVar29 & 0xffffffff);
              *(RK_U8 **)((long)pvVar2 + 0x10) = pRVar14;
              *(undefined4 *)((long)pvVar2 + 0x38) = 0x10;
              bVar24 = ((byte)local_2b0.task.part_first & 1) << 5 | 0x10;
              *(byte *)((long)pvVar2 + 0x38) = bVar24;
              *(byte *)((long)pvVar2 + 0x38) = ((byte)local_2b0.task.part_last & 1) << 6 | bVar24;
              if (!bVar33) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(int)uVar29);
                _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                           (ulong)local_2b0.task.part_count,pRVar14,in_stack_fffffffffffffcb8);
                if ((mpp_enc_debug & 0x20) != 0) {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                        local_2b0.task.part_count);
                  local_2b0.task.part_pos = (RK_U8 *)pMVar30;
                  _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                             "try_proc_low_deley_task",local_2b0.rc.frm.val >> 0x30,
                             pMVar34->task_pts,in_stack_fffffffffffffcb8);
                  pMVar30 = (MppEncRefFrmUsrCfg *)local_2b0.task.part_pos;
                }
              }
              local_2b0.task.part_pos = (RK_U8 *)pMVar30;
              mpp_task_meta_set_packet(pMVar34->task_out,KEY_OUTPUT_PACKET,pvVar2);
              _mpp_port_enqueue("try_proc_low_deley_task",pMVar34->output,pMVar34->task_out);
              pMVar34->task_out = (MppTask)0x0;
              local_2b0.task.part_count = 0;
              local_2b0.status.val = local_2b0.status.val & 0xfffffbff;
              RVar20 = mpp_time();
              pMVar34->time_end = RVar20;
              pMVar34->frame_count = pMVar34->frame_count + 1;
              if ((((pMVar34->dev != (MppDev)0x0) && (pMVar34->time_base != 0)) && (RVar20 != 0)) &&
                 (999999 < RVar20 - pMVar34->time_base)) {
                update_hal_info_fps(pMVar34);
              }
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","try_proc_low_deley_task",
                           local_2b0.rc.frm.val >> 0x30);
              }
              MVar18 = rc_hal_end(pMVar34->rc_ctx,&local_2b0.rc);
              if (MVar18 == MPP_OK) break;
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar18);
              _mpp_log_l(2,"mpp_enc","mpp %p rc_hal_end:%-4d failed return %d",(char *)0x0,local_2f8
                         ,0x99c,in_stack_fffffffffffffcb8);
              pMVar15 = local_2f0;
            }
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_low_deley_task",
                         local_2b0.rc.frm.val >> 0x30,pMVar34->task_pts);
            }
            mpp_task_meta_set_frame(pMVar34->task_in,KEY_INPUT_FRAME,pMVar34->frame);
            _mpp_port_enqueue("try_proc_low_deley_task",pMVar34->input,pMVar34->task_in);
            pMVar34->task_in = (MppTask)0x0;
            pMVar34->task_out = (MppTask)0x0;
            pMVar34->frame = (MppFrame)0x0;
            pMVar34->packet = (MppPacket)0x0;
            pMVar34->frm_buf = (MppBuffer)0x0;
            pMVar34->pkt_buf = (MppBuffer)0x0;
            (pMVar34->hdr_status).val = *(byte *)&pMVar34->hdr_status & 1;
            local_2b0.status.val = 0;
            local_2b0.usr.force_flag = 0;
            this = local_300;
          }
        }
      }
LAB_00140c7b:
      pthread_mutex_lock(local_2d8);
      MVar17 = MppThread::get_status(this,THREAD_WORK);
    } while (MVar17 == MPP_THREAD_RUNNING);
  }
  pthread_mutex_unlock(local_2d8);
  release_task_in_port(enc->input);
  release_task_in_port(*(MppPort *)((long)local_2f8 + 0x58));
  return (void *)0x0;
}

Assistant:

void *mpp_enc_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc  = enc->thread_enc;
    EncAsyncTaskInfo task;
    EncAsyncWait wait;
    EncAsyncStatus *status = &task.status;
    MPP_RET ret = MPP_OK;

    memset(&task, 0, sizeof(task));
    wait.val = 0;

    enc->time_base = mpp_time();

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_task_wait(enc, &wait))
                thd_enc->wait();
        }

        // When encoder is not on encoding process external config and reset
        if (!status->enc_start) {
            // 1. process user control
            if (enc->cmd_send != enc->cmd_recv) {
                enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                wait.val = 0;
                continue;
            }

            // 2. process reset
            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");
                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
                wait.val = 0;
                continue;
            }

            // 3. try get a task to encode
            ret = try_get_enc_task(enc, &task, &wait);
            if (ret)
                continue;
        }

        mpp_assert(status->enc_start);
        if (!status->enc_start)
            continue;

        // check partition low delay encoding
        /*
         * NOTE: Only when both split encoding and low delay mode are set then
         *       use special low delay path
         */
        if (enc->low_delay_part_mode)
            try_proc_low_deley_task(mpp, &task, &wait);
        else
            try_proc_normal_task(enc, &task);
    }

    // clear remain task in enc->output port
    release_task_in_port(enc->input);
    release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}